

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree.cxx
# Opt level: O0

int __thiscall Fl_Tree::deselect_all(Fl_Tree *this,Fl_Tree_Item *item,int docallback)

{
  char cVar1;
  int iVar2;
  Fl_Tree_Item *item_00;
  Fl_Tree_Item *local_40;
  int local_2c;
  uint local_28;
  int t;
  int count;
  int docallback_local;
  Fl_Tree_Item *item_local;
  Fl_Tree *this_local;
  
  local_40 = item;
  if (item == (Fl_Tree_Item *)0x0) {
    local_40 = first(this);
  }
  if (local_40 == (Fl_Tree_Item *)0x0) {
    this_local._4_4_ = 0;
  }
  else {
    local_28 = 0;
    cVar1 = Fl_Tree_Item::is_selected(local_40);
    if (cVar1 != '\0') {
      iVar2 = deselect(this,local_40,docallback);
      local_28 = (uint)(iVar2 != 0);
    }
    for (local_2c = 0; iVar2 = Fl_Tree_Item::children(local_40), local_2c < iVar2;
        local_2c = local_2c + 1) {
      item_00 = Fl_Tree_Item::child(local_40,local_2c);
      iVar2 = deselect_all(this,item_00,docallback);
      local_28 = iVar2 + local_28;
    }
    this_local._4_4_ = local_28;
  }
  return this_local._4_4_;
}

Assistant:

int Fl_Tree::deselect_all(Fl_Tree_Item *item, int docallback) {
  item = item ? item : first();			// NULL? use first()
  if ( ! item ) return(0);
  int count = 0;
  // Deselect item
  if ( item->is_selected() )
    if ( deselect(item, docallback) )
      ++count;
  // Deselect its children
  for ( int t=0; t<item->children(); t++ ) {
    count += deselect_all(item->child(t), docallback);	// recurse
  }
  return(count);
}